

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

BOOL Internal_ExtractFormatW
               (CPalThread *pthrCurrent,LPCWSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  LPSTR pCVar1;
  WCHAR WVar2;
  LPCWSTR pWVar3;
  int iVar4;
  size_t sVar5;
  char *__nptr;
  int *piVar6;
  WCHAR *pWVar7;
  CHAR CVar8;
  BOOL BVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  LPSTR pCVar13;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pWVar3 = *Fmt;
  if (pWVar3 == (LPCWSTR)0x0) {
    return 0;
  }
  if (*pWVar3 != L'%') {
    return 0;
  }
  *Fmt = pWVar3 + 1;
  *Out = '%';
  sVar5 = PAL_wcslen(*Fmt);
  __nptr = (char *)CorUnix::InternalMalloc(sVar5 + 1);
  if (__nptr != (char *)0x0) {
    do {
      pCVar13 = Out + 1;
      pWVar3 = *Fmt;
      WVar2 = *pWVar3;
      if (WVar2 == L' ') {
        uVar11 = 8;
      }
      else if (WVar2 == L'#') {
        uVar11 = 2;
      }
      else {
        uVar10 = (uint)(ushort)WVar2;
        if (uVar10 == 0x30) {
          uVar11 = 4;
        }
        else {
          uVar11 = 1;
          if (uVar10 != 0x2d) {
            if (uVar10 != 0x2b) goto LAB_0030cf82;
            uVar11 = 0x10;
          }
        }
      }
      *Flags = *Flags | uVar11;
      *Fmt = pWVar3 + 1;
      *pCVar13 = (CHAR)WVar2;
      Out = pCVar13;
    } while( true );
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    piVar6 = __errno_location();
    *piVar6 = 8;
    return 0;
  }
  goto LAB_0030d463;
LAB_0030cf82:
  if ((~*Flags & 5U) == 0) {
    *Flags = *Flags - 4;
  }
  iVar4 = isdigit(uVar10);
  if (iVar4 != 0) {
    lVar12 = 1;
    while (iVar4 = isdigit((uint)(ushort)**Fmt), iVar4 != 0) {
      __nptr[lVar12 + -1] = (char)**Fmt;
      pWVar3 = *Fmt;
      *Fmt = pWVar3 + 1;
      Out[lVar12] = (CHAR)*pWVar3;
      lVar12 = lVar12 + 1;
    }
    __nptr[lVar12 + -1] = '\0';
    iVar4 = atoi(__nptr);
    *Width = iVar4;
    if (-1 < iVar4) {
      pCVar13 = Out + lVar12;
      goto LAB_0030d06d;
    }
LAB_0030d132:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar6 = __errno_location();
      *piVar6 = 0x54f;
      return 0;
    }
LAB_0030d463:
    abort();
  }
  pWVar3 = *Fmt;
  if (*pWVar3 == L'*') {
    *Width = -2;
    *Fmt = pWVar3 + 1;
    Out[1] = '*';
    pCVar13 = Out + 2;
    iVar4 = isdigit((uint)(ushort)**Fmt);
    if (iVar4 != 0) {
      *Width = -3;
      while (iVar4 = isdigit((uint)(ushort)**Fmt), iVar4 != 0) {
        pWVar3 = *Fmt;
        *Fmt = pWVar3 + 1;
        *pCVar13 = (CHAR)*pWVar3;
        pCVar13 = pCVar13 + 1;
      }
    }
  }
LAB_0030d06d:
  if (**Fmt == L'.') {
    *Fmt = *Fmt + 1;
    pCVar1 = pCVar13 + 1;
    *pCVar13 = '.';
    iVar4 = isdigit((uint)(ushort)**Fmt);
    if (iVar4 == 0) {
      pWVar3 = *Fmt;
      if (*pWVar3 == L'*') {
        *Precision = -2;
        *Fmt = pWVar3 + 1;
        pCVar13[1] = '*';
        pCVar13 = pCVar13 + 2;
        iVar4 = isdigit((uint)(ushort)**Fmt);
        if (iVar4 != 0) {
          *Precision = -4;
          while (iVar4 = isdigit((uint)(ushort)**Fmt), iVar4 != 0) {
            pWVar3 = *Fmt;
            *Fmt = pWVar3 + 1;
            *pCVar13 = (CHAR)*pWVar3;
            pCVar13 = pCVar13 + 1;
          }
        }
      }
      else {
        *Precision = -3;
        pCVar13 = pCVar1;
      }
    }
    else {
      lVar12 = 0;
      while (iVar4 = isdigit((uint)(ushort)**Fmt), iVar4 != 0) {
        __nptr[lVar12] = (char)**Fmt;
        pWVar3 = *Fmt;
        *Fmt = pWVar3 + 1;
        pCVar1[lVar12] = (CHAR)*pWVar3;
        lVar12 = lVar12 + 1;
      }
      __nptr[lVar12] = '\0';
      iVar4 = atoi(__nptr);
      *Precision = iVar4;
      if (iVar4 < 0) goto LAB_0030d132;
      pCVar13 = pCVar1 + lVar12;
    }
  }
  pWVar3 = *Fmt;
  WVar2 = *pWVar3;
  if (WVar2 != L'I') {
    if (WVar2 == L'L') {
LAB_0030d1ed:
      pWVar7 = pWVar3 + 1;
      goto LAB_0030d1f1;
    }
    if (WVar2 == L'h') {
      *Prefix = 1;
      goto LAB_0030d1ed;
    }
    if ((WVar2 == L'l') || (WVar2 == L'w')) {
      pWVar7 = pWVar3 + 1;
      *Fmt = pWVar7;
      WVar2 = pWVar3[1];
      if (WVar2 != L'C') {
        if (WVar2 == L'l') {
          *Prefix = 3;
          pWVar7 = pWVar3 + 2;
          goto LAB_0030d1f1;
        }
        if (WVar2 != L'S') goto LAB_0030d25b;
      }
      *Prefix = 4;
      goto LAB_0030d255;
    }
    pWVar7 = pWVar3;
    if (WVar2 != L'p') goto LAB_0030d25b;
    *Prefix = 3;
switchD_0030d274_caseD_70:
    *Type = 5;
    *Fmt = pWVar7 + 1;
    iVar4 = *Prefix;
    if (iVar4 == 3) {
      if (*Precision == -1) {
        *Precision = 0x10;
        pCVar13[0] = '.';
        pCVar13[1] = '1';
        pCVar13[2] = '6';
        pCVar13 = pCVar13 + 3;
      }
      pCVar13[0] = 'l';
      pCVar13[1] = 'l';
      pCVar13 = pCVar13 + 2;
    }
    else {
      if (*Precision == -1) {
        *Precision = 8;
        pCVar13[0] = '.';
        pCVar13[1] = '8';
        pCVar13 = pCVar13 + 2;
        iVar4 = *Prefix;
      }
      if (iVar4 == 4) {
        *Prefix = 2;
      }
    }
    *pCVar13 = 'X';
    goto LAB_0030d3ec;
  }
  if (pWVar3[1] == L'3') {
    if (pWVar3[2] != L'2') goto LAB_0030d245;
    pWVar7 = pWVar3 + 3;
LAB_0030d1f1:
    *Fmt = pWVar7;
  }
  else {
    if ((pWVar3[1] == L'6') && (pWVar3[2] == L'4')) {
      pWVar7 = pWVar3 + 3;
    }
    else {
LAB_0030d245:
      pWVar7 = pWVar3 + 1;
    }
    *Fmt = pWVar7;
    *Prefix = 3;
  }
LAB_0030d255:
  WVar2 = *pWVar7;
LAB_0030d25b:
  switch(WVar2) {
  case L'd':
  case L'i':
  case L'o':
  case L'u':
  case L'x':
switchD_0030d274_caseD_64:
    *Type = 4;
    switch(*Prefix) {
    case 1:
      *pCVar13 = 'h';
      pCVar13 = pCVar13 + 1;
      break;
    case 2:
    case 4:
      *pCVar13 = 'l';
      pCVar13 = pCVar13 + 1;
      *Prefix = 2;
      break;
    case 3:
      pCVar13[0] = 'l';
      pCVar13[1] = 'l';
      pCVar13 = pCVar13 + 2;
    }
    pWVar3 = *Fmt;
    *Fmt = pWVar3 + 1;
    *pCVar13 = (CHAR)*pWVar3;
    goto LAB_0030d3ec;
  case L'e':
  case L'f':
  case L'g':
switchD_0030d274_caseD_65:
    if (*Prefix == 4) {
      *Prefix = 2;
    }
    *Type = 7;
    *Fmt = pWVar7 + 1;
    *pCVar13 = (CHAR)WVar2;
LAB_0030d3ec:
    pCVar13 = pCVar13 + 1;
    break;
  case L'h':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'q':
  case L'r':
  case L't':
  case L'v':
  case L'w':
switchD_0030d274_caseD_68:
    BVar9 = 0;
    goto LAB_0030d446;
  case L'n':
    if (*Prefix == 1) {
      *pCVar13 = 'h';
      pCVar13 = pCVar13 + 1;
      pWVar7 = *Fmt;
      CVar8 = (CHAR)*pWVar7;
    }
    else {
      CVar8 = 'n';
      if (*Prefix == 4) {
        *Prefix = 2;
      }
    }
    *Fmt = pWVar7 + 1;
    *pCVar13 = CVar8;
    pCVar13 = pCVar13 + 1;
    *Type = 6;
    break;
  case L'p':
    goto switchD_0030d274_caseD_70;
  case L's':
switchD_0030d274_caseD_73:
    *Type = WVar2 == L'S' | 2;
    if (*Prefix != 1) {
      if (WVar2 == L's') {
        *Prefix = 2;
      }
      else if (*Prefix != 2) goto LAB_0030d413;
      *pCVar13 = 'l';
      pCVar13 = pCVar13 + 1;
    }
LAB_0030d413:
    *pCVar13 = 's';
    goto LAB_0030d417;
  default:
    if (WVar2 == L'X') goto switchD_0030d274_caseD_64;
    if ((WVar2 == L'E') || (WVar2 == L'G')) goto switchD_0030d274_caseD_65;
    if (WVar2 == L'S') goto switchD_0030d274_caseD_73;
    if (WVar2 != L'C') goto switchD_0030d274_caseD_68;
  case L'c':
    *Type = 1;
    iVar4 = *Prefix;
    if ((iVar4 != 1) && (((WVar2 == L'c' || (iVar4 == 4)) || (iVar4 == 2)))) {
      *pCVar13 = 'l';
      pCVar13 = pCVar13 + 1;
      *Prefix = 2;
    }
    *pCVar13 = 'c';
LAB_0030d417:
    pCVar13 = pCVar13 + 1;
    *Fmt = *Fmt + 1;
  }
  BVar9 = 1;
LAB_0030d446:
  *pCVar13 = '\0';
  CorUnix::InternalFree(__nptr);
  return BVar9;
}

Assistant:

BOOL Internal_ExtractFormatW(CPalThread *pthrCurrent, LPCWSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = (CHAR) *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(PAL_wcslen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
            case '-':
                *Flags |= PFF_MINUS; break;
            case '+':
                *Flags |= PFF_PLUS; break;
            case '0':
                *Flags |= PFF_ZERO; break;
            case ' ':
                *Flags |= PFF_SPACE; break;
            case '#':
                *Flags |= PFF_POUND; break;
        }
            *Out++ = (CHAR) *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit(**Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit(**Fmt))
        {
            *TempStrPtr++ = (CHAR) **Fmt;
            *Out++ = (CHAR) *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit(**Fmt))
            {
                *Out++ = (CHAR) *(*Fmt)++;
            }
        }
    }

    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit(**Fmt))
            {
                *TempStrPtr++ = (CHAR) **Fmt;
                *Out++ = (CHAR) *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = (CHAR) *(*Fmt)++;
            if (isdigit(**Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit(**Fmt))
                {
                    *Out++ = (CHAR) *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
 #ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'C' || **Fmt == 'S')
#endif
        {
            *Prefix = PFF_PREFIX_LONG_W;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }


    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'c')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S' )
    {
        if ( **Fmt == 'S' )
        {
           *Type = PFF_TYPE_WSTRING;
        }
        else
        {
            *Type = PFF_TYPE_STRING;
        }
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 's')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }

        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
            if (*Prefix == PFF_PREFIX_LONG_W)
            {
                *Prefix = PFF_PREFIX_LONG;
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}